

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::CopyScene(aiScene **_dest,aiScene *src,bool allocate)

{
  uint uVar1;
  aiMetadata *rhs;
  aiAnimation **ppaVar2;
  aiTexture **ppaVar3;
  aiMaterial **ppaVar4;
  aiLight **ppaVar5;
  aiCamera **ppaVar6;
  aiMesh **ppaVar7;
  aiScene *paVar8;
  aiMetadata *this;
  aiAnimation **ppaVar9;
  aiTexture **ppaVar10;
  aiMaterial **ppaVar11;
  aiLight **ppaVar12;
  aiCamera **ppaVar13;
  aiMesh **ppaVar14;
  undefined4 uVar15;
  ulong uVar16;
  ulong uVar17;
  
  if (src != (aiScene *)0x0 && _dest != (aiScene **)0x0) {
    if (allocate) {
      paVar8 = (aiScene *)operator_new(0x80);
      aiScene::aiScene(paVar8);
      *_dest = paVar8;
    }
    paVar8 = *_dest;
    rhs = src->mMetaData;
    if (rhs != (aiMetadata *)0x0) {
      this = (aiMetadata *)operator_new(0x18);
      aiMetadata::aiMetadata(this,rhs);
      paVar8->mMetaData = this;
    }
    uVar1 = src->mNumAnimations;
    paVar8->mNumAnimations = uVar1;
    if ((ulong)uVar1 == 0) {
      paVar8->mAnimations = (aiAnimation **)0x0;
    }
    else {
      ppaVar2 = src->mAnimations;
      uVar17 = (ulong)uVar1 << 3;
      ppaVar9 = (aiAnimation **)operator_new__(uVar17);
      paVar8->mAnimations = ppaVar9;
      uVar16 = 0;
      do {
        Copy((aiAnimation **)((long)paVar8->mAnimations + uVar16),
             *(aiAnimation **)((long)ppaVar2 + uVar16));
        uVar16 = uVar16 + 8;
      } while (uVar17 != uVar16);
    }
    uVar1 = src->mNumTextures;
    paVar8->mNumTextures = uVar1;
    if ((ulong)uVar1 == 0) {
      paVar8->mTextures = (aiTexture **)0x0;
    }
    else {
      ppaVar3 = src->mTextures;
      uVar17 = (ulong)uVar1 << 3;
      ppaVar10 = (aiTexture **)operator_new__(uVar17);
      paVar8->mTextures = ppaVar10;
      uVar16 = 0;
      do {
        Copy((aiTexture **)((long)paVar8->mTextures + uVar16),
             *(aiTexture **)((long)ppaVar3 + uVar16));
        uVar16 = uVar16 + 8;
      } while (uVar17 != uVar16);
    }
    uVar1 = src->mNumMaterials;
    paVar8->mNumMaterials = uVar1;
    if ((ulong)uVar1 == 0) {
      paVar8->mMaterials = (aiMaterial **)0x0;
    }
    else {
      ppaVar4 = src->mMaterials;
      uVar17 = (ulong)uVar1 << 3;
      ppaVar11 = (aiMaterial **)operator_new__(uVar17);
      paVar8->mMaterials = ppaVar11;
      uVar16 = 0;
      do {
        Copy((aiMaterial **)((long)paVar8->mMaterials + uVar16),
             *(aiMaterial **)((long)ppaVar4 + uVar16));
        uVar16 = uVar16 + 8;
      } while (uVar17 != uVar16);
    }
    uVar1 = src->mNumLights;
    paVar8->mNumLights = uVar1;
    if ((ulong)uVar1 == 0) {
      paVar8->mLights = (aiLight **)0x0;
    }
    else {
      ppaVar5 = src->mLights;
      uVar17 = (ulong)uVar1 << 3;
      ppaVar12 = (aiLight **)operator_new__(uVar17);
      paVar8->mLights = ppaVar12;
      uVar16 = 0;
      do {
        Copy((aiLight **)((long)paVar8->mLights + uVar16),*(aiLight **)((long)ppaVar5 + uVar16));
        uVar16 = uVar16 + 8;
      } while (uVar17 != uVar16);
    }
    uVar1 = src->mNumCameras;
    paVar8->mNumCameras = uVar1;
    if ((ulong)uVar1 == 0) {
      paVar8->mCameras = (aiCamera **)0x0;
    }
    else {
      ppaVar6 = src->mCameras;
      uVar17 = (ulong)uVar1 << 3;
      ppaVar13 = (aiCamera **)operator_new__(uVar17);
      paVar8->mCameras = ppaVar13;
      uVar16 = 0;
      do {
        Copy((aiCamera **)((long)paVar8->mCameras + uVar16),*(aiCamera **)((long)ppaVar6 + uVar16));
        uVar16 = uVar16 + 8;
      } while (uVar17 != uVar16);
    }
    uVar1 = src->mNumMeshes;
    paVar8->mNumMeshes = uVar1;
    if ((ulong)uVar1 == 0) {
      paVar8->mMeshes = (aiMesh **)0x0;
    }
    else {
      ppaVar7 = src->mMeshes;
      uVar17 = (ulong)uVar1 << 3;
      ppaVar14 = (aiMesh **)operator_new__(uVar17);
      paVar8->mMeshes = ppaVar14;
      uVar16 = 0;
      do {
        Copy((aiMesh **)((long)paVar8->mMeshes + uVar16),*(aiMesh **)((long)ppaVar7 + uVar16));
        uVar16 = uVar16 + 8;
      } while (uVar17 != uVar16);
    }
    Copy(&paVar8->mRootNode,src->mRootNode);
    paVar8->mFlags = src->mFlags;
    if (paVar8->mPrivate != (void *)0x0) {
      if (src->mPrivate == (void *)0x0) {
        uVar15 = 0;
      }
      else {
        uVar15 = *(undefined4 *)((long)src->mPrivate + 8);
      }
      *(undefined4 *)((long)paVar8->mPrivate + 8) = uVar15;
    }
  }
  return;
}

Assistant:

void SceneCombiner::CopyScene(aiScene** _dest,const aiScene* src,bool allocate) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    if (allocate) {
        *_dest = new aiScene();
    }
    aiScene* dest = *_dest;
    ai_assert(nullptr != dest);

    // copy metadata
    if ( nullptr != src->mMetaData ) {
        dest->mMetaData = new aiMetadata( *src->mMetaData );
    }

    // copy animations
    dest->mNumAnimations = src->mNumAnimations;
    CopyPtrArray(dest->mAnimations,src->mAnimations,
        dest->mNumAnimations);

    // copy textures
    dest->mNumTextures = src->mNumTextures;
    CopyPtrArray(dest->mTextures,src->mTextures,
        dest->mNumTextures);

    // copy materials
    dest->mNumMaterials = src->mNumMaterials;
    CopyPtrArray(dest->mMaterials,src->mMaterials,
        dest->mNumMaterials);

    // copy lights
    dest->mNumLights = src->mNumLights;
    CopyPtrArray(dest->mLights,src->mLights,
        dest->mNumLights);

    // copy cameras
    dest->mNumCameras = src->mNumCameras;
    CopyPtrArray(dest->mCameras,src->mCameras,
        dest->mNumCameras);

    // copy meshes
    dest->mNumMeshes = src->mNumMeshes;
    CopyPtrArray(dest->mMeshes,src->mMeshes,
        dest->mNumMeshes);

    // now - copy the root node of the scene (deep copy, too)
    Copy( &dest->mRootNode, src->mRootNode);

    // and keep the flags ...
    dest->mFlags = src->mFlags;

    // source private data might be NULL if the scene is user-allocated (i.e. for use with the export API)
    if (dest->mPrivate != NULL) {
        ScenePriv(dest)->mPPStepsApplied = ScenePriv(src) ? ScenePriv(src)->mPPStepsApplied : 0;
    }
}